

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  void *__s;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  undefined1 *puVar8;
  uint __c;
  ulong uVar9;
  undefined1 *puVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int local_64;
  
  uVar1 = dst->w;
  lVar4 = (long)(int)uVar1;
  iVar2 = dst->h;
  puVar8 = (undefined1 *)src->data;
  __s = dst->data;
  if (type == 0) {
    __c = (uint)(byte)v;
    iVar7 = top;
    if (top < 1) {
      iVar6 = 0;
    }
    else {
      do {
        if (0 < (int)uVar1) {
          memset(__s,__c,(ulong)uVar1);
        }
        __s = (void *)((long)__s + lVar4);
        iVar7 = iVar7 + -1;
        iVar6 = top;
      } while (iVar7 != 0);
    }
    if (iVar6 < src->h + top) {
      lVar5 = (long)left;
      uVar12 = 0;
      if (0 < left) {
        uVar12 = (ulong)(uint)left;
      }
      do {
        uVar9 = 0;
        if (0 < left) {
          memset(__s,__c,(ulong)(uint)left);
          uVar9 = (ulong)(uint)left;
        }
        if ((long)src->w < 0xc) {
          uVar13 = uVar12;
          if ((int)uVar9 < src->w + left) {
            do {
              *(undefined1 *)((long)__s + uVar13) = puVar8[uVar13 - lVar5];
              uVar9 = uVar13 + 1;
              uVar13 = uVar9;
            } while ((long)uVar9 < src->w + lVar5);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar5),puVar8,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        uVar11 = (uint)uVar9;
        if ((int)uVar11 < (int)uVar1) {
          memset((void *)((long)(int)uVar11 + (long)__s),__c,(ulong)(~uVar11 + uVar1) + 1);
        }
        puVar8 = puVar8 + src->w;
        __s = (void *)((long)__s + lVar4);
        iVar6 = iVar6 + 1;
      } while (iVar6 < src->h + top);
    }
    local_64 = iVar2 - iVar6;
    if (local_64 != 0 && iVar6 <= iVar2) {
      do {
        if (0 < (int)uVar1) {
          memset(__s,__c,(ulong)uVar1);
        }
        __s = (void *)((long)__s + lVar4);
        local_64 = local_64 + -1;
      } while (local_64 != 0);
    }
  }
  else if (type == 2) {
    puVar8 = puVar8 + (long)src->w * (long)top;
    if (top < 1) {
      iVar7 = 0;
    }
    else {
      lVar5 = (long)left;
      iVar6 = 0;
      do {
        uVar12 = 0;
        if (0 < left) {
          puVar10 = puVar8 + lVar5;
          uVar12 = 0;
          do {
            *(undefined1 *)((long)__s + uVar12) = *puVar10;
            uVar12 = uVar12 + 1;
            puVar10 = puVar10 + -1;
          } while ((uint)left != uVar12);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar12 < src->w + left) {
            uVar12 = uVar12 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar12) = puVar8[uVar12 - lVar5];
              uVar12 = uVar12 + 1;
            } while ((long)uVar12 < src->w + lVar5);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar5),puVar8,(long)src->w);
          uVar12 = (ulong)(uint)((int)uVar12 + src->w);
        }
        iVar7 = (int)uVar12;
        if (iVar7 < (int)uVar1) {
          lVar3 = (long)iVar7;
          iVar7 = (left + -2) - iVar7;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar8[iVar7 + src->w * 2];
            lVar3 = lVar3 + 1;
            iVar7 = iVar7 + -1;
          } while (lVar4 != lVar3);
        }
        __s = (void *)((long)__s + lVar4);
        puVar8 = puVar8 + -(long)src->w;
        iVar6 = iVar6 + 1;
        iVar7 = top;
      } while (iVar6 != top);
    }
    if (iVar7 < src->h + top) {
      lVar5 = (long)left;
      do {
        uVar12 = 0;
        if (0 < left) {
          puVar10 = puVar8 + lVar5;
          uVar12 = 0;
          do {
            *(undefined1 *)((long)__s + uVar12) = *puVar10;
            uVar12 = uVar12 + 1;
            puVar10 = puVar10 + -1;
          } while ((uint)left != uVar12);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar12 < src->w + left) {
            uVar12 = uVar12 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar12) = puVar8[uVar12 - lVar5];
              uVar12 = uVar12 + 1;
            } while ((long)uVar12 < src->w + lVar5);
          }
        }
        else {
          memcpy((void *)(lVar5 + (long)__s),puVar8,(long)src->w);
          uVar12 = (ulong)(uint)((int)uVar12 + src->w);
        }
        iVar6 = (int)uVar12;
        if (iVar6 < (int)uVar1) {
          lVar3 = (long)iVar6;
          iVar6 = (left + -2) - iVar6;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar8[iVar6 + src->w * 2];
            lVar3 = lVar3 + 1;
            iVar6 = iVar6 + -1;
          } while (lVar4 != lVar3);
        }
        puVar8 = puVar8 + src->w;
        __s = (void *)((long)__s + lVar4);
        iVar7 = iVar7 + 1;
      } while (iVar7 < src->h + top);
    }
    if (iVar7 < iVar2) {
      puVar8 = puVar8 + (long)src->w * -2;
      lVar5 = (long)left;
      do {
        uVar12 = 0;
        if (0 < left) {
          puVar10 = puVar8 + lVar5;
          uVar12 = 0;
          do {
            *(undefined1 *)((long)__s + uVar12) = *puVar10;
            uVar12 = uVar12 + 1;
            puVar10 = puVar10 + -1;
          } while ((uint)left != uVar12);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar12 < src->w + left) {
            uVar12 = uVar12 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar12) = puVar8[uVar12 - lVar5];
              uVar12 = uVar12 + 1;
            } while ((long)uVar12 < src->w + lVar5);
          }
        }
        else {
          memcpy((void *)(lVar5 + (long)__s),puVar8,(long)src->w);
          uVar12 = (ulong)(uint)((int)uVar12 + src->w);
        }
        iVar6 = (int)uVar12;
        if (iVar6 < (int)uVar1) {
          lVar3 = (long)iVar6;
          iVar6 = (left + -2) - iVar6;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar8[iVar6 + src->w * 2];
            lVar3 = lVar3 + 1;
            iVar6 = iVar6 + -1;
          } while (lVar4 != lVar3);
        }
        __s = (void *)((long)__s + lVar4);
        puVar8 = puVar8 + -(long)src->w;
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar2);
    }
  }
  else if (type == 1) {
    lVar5 = (long)left;
    uVar12 = (ulong)(uint)left;
    if (top < 1) {
      iVar7 = 0;
    }
    else {
      iVar6 = 0;
      do {
        uVar9 = 0;
        if (0 < left) {
          uVar9 = 0;
          do {
            *(undefined1 *)((long)__s + uVar9) = *puVar8;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar9 < src->w + left) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar8[uVar9 - lVar5];
              uVar9 = uVar9 + 1;
            } while ((long)uVar9 < src->w + lVar5);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar5),puVar8,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        if ((int)uVar9 < (int)uVar1) {
          lVar3 = (long)(int)uVar9;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar8[(long)src->w + -1];
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        __s = (void *)((long)__s + lVar4);
        iVar6 = iVar6 + 1;
        iVar7 = top;
      } while (iVar6 != top);
    }
    if (iVar7 < src->h + top) {
      do {
        uVar9 = 0;
        if (0 < left) {
          uVar9 = 0;
          do {
            *(undefined1 *)((long)__s + uVar9) = *puVar8;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar9 < src->w + left) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar8[uVar9 - lVar5];
              uVar9 = uVar9 + 1;
            } while ((long)uVar9 < src->w + lVar5);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar5),puVar8,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        if ((int)uVar9 < (int)uVar1) {
          lVar3 = (long)(int)uVar9;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar8[(long)src->w + -1];
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        puVar8 = puVar8 + src->w;
        __s = (void *)((long)__s + lVar4);
        iVar7 = iVar7 + 1;
      } while (iVar7 < src->h + top);
    }
    if (iVar7 < iVar2) {
      iVar6 = src->w;
      puVar10 = puVar8 + -(long)iVar6;
      do {
        uVar9 = 0;
        if (0 < left) {
          uVar9 = 0;
          do {
            *(undefined1 *)((long)__s + uVar9) = *puVar10;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
        }
        if ((long)src->w < 0xc) {
          if ((int)uVar9 < src->w + left) {
            uVar9 = uVar9 & 0xffffffff;
            do {
              *(undefined1 *)((long)__s + uVar9) = puVar8[uVar9 + (-lVar5 - (long)iVar6)];
              uVar9 = uVar9 + 1;
            } while ((long)uVar9 < src->w + lVar5);
          }
        }
        else {
          memcpy((void *)((long)__s + lVar5),puVar10,(long)src->w);
          uVar9 = (ulong)(uint)((int)uVar9 + src->w);
        }
        if ((int)uVar9 < (int)uVar1) {
          lVar3 = (long)(int)uVar9;
          do {
            *(undefined1 *)((long)__s + lVar3) = puVar10[(long)src->w + -1];
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        __s = (void *)((long)__s + lVar4);
        iVar7 = iVar7 + 1;
      } while (iVar7 != iVar2);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }
    else if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }
    else if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}